

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall
socketsys::UnixServerProvider::bind
          (UnixServerProvider *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  SocketBindException *this_00;
  int *piVar3;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar4;
  addrinfo *res;
  socklen_t length;
  int type;
  socklen_t size;
  array<char,_6UL> portBuffer;
  sockaddr data;
  addrinfo *local_98;
  socklen_t local_8c;
  int local_88 [2];
  char local_80 [8];
  sockaddr local_78;
  addrinfo local_68;
  
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[0] = '\0';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  sprintf(local_80,"%d");
  local_78.sa_family = 0;
  local_78.sa_data[0] = '\0';
  local_78.sa_data[1] = '\0';
  local_78.sa_data[2] = '\0';
  local_78.sa_data[3] = '\0';
  local_78.sa_data[4] = '\0';
  local_78.sa_data[5] = '\0';
  local_78.sa_data[6] = '\0';
  local_78.sa_data[7] = '\0';
  local_78.sa_data[8] = '\0';
  local_78.sa_data[9] = '\0';
  local_78.sa_data[10] = '\0';
  local_78.sa_data[0xb] = '\0';
  local_78.sa_data[0xc] = '\0';
  local_78.sa_data[0xd] = '\0';
  local_88[1] = 0x10;
  iVar2 = (int)this;
  getsockname(iVar2,&local_78,(socklen_t *)(local_88 + 1));
  local_8c = 4;
  getsockopt(iVar2,1,3,local_88,&local_8c);
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68._0_8_ = (local_78._0_8_ & 0xffff) << 0x20;
  local_68.ai_protocol = 0x11;
  if (local_88[0] == 1) {
    local_68.ai_protocol = 6;
  }
  local_68.ai_socktype = local_88[0];
  iVar1 = getaddrinfo(*(char **)(CONCAT44(in_register_00000034,__fd) + 8),local_80,&local_68,
                      &local_98);
  if (iVar1 == 0) {
    iVar1 = ::bind(iVar2,local_98->ai_addr,local_98->ai_addrlen);
    freeaddrinfo(local_98);
    if (iVar1 != -1) {
      iVar2 = listen(iVar2,__len);
      if (iVar2 != -1) {
        return iVar2;
      }
    }
    this_00 = (SocketBindException *)__cxa_allocate_exception(0x10);
    piVar3 = __errno_location();
    SocketBindException::SocketBindException(this_00,"Linux failed to bind server socket ",*piVar3);
    ppuVar4 = &SocketBindException::typeinfo;
  }
  else {
    this_00 = (SocketBindException *)__cxa_allocate_exception(0x10);
    NameResolveException::NameResolveException
              ((NameResolveException *)this_00,"Linux failed to resolve address ",iVar1);
    ppuVar4 = &NameResolveException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar4,std::runtime_error::~runtime_error);
}

Assistant:

void UnixServerProvider::bind(SocketHandle handle, const std::string_view& address, uint16_t port, size_t backlog) {
    std::array<char, 6> portBuffer{};
    sprintf(portBuffer.data(),"%d", port);

    sockaddr data{};
    socklen_t size = sizeof(sockaddr);
    getsockname(handle, &data, &size);

    int type;
    socklen_t length = sizeof(int);
    getsockopt(handle, SOL_SOCKET, SO_TYPE, &type, &length);

    addrinfo hints {
            {},
            data.sa_family,
            type,
            type == SOCK_STREAM ? IPPROTO_TCP : IPPROTO_UDP,
    };

    addrinfo* res;
    auto result = getaddrinfo(address.data(), portBuffer.data(), &hints, &res);
    if (result != 0) {
        throw NameResolveException("Linux failed to resolve address ", result);
    }

    result = ::bind(handle, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);

    if (result != -1) result = listen(handle, static_cast<int>(backlog));
    if (result == -1) {
        throw SocketBindException("Linux failed to bind server socket ", errno);
    }
}